

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

void Wlc_NtkTransferNames(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  
  if ((0 < (pNew->vCopies).nSize) || ((p->vCopies).nSize < 1)) {
    __assert_fail("!Wlc_NtkHasCopy(pNew) && Wlc_NtkHasCopy(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcNtk.c"
                  ,0x23f,"void Wlc_NtkTransferNames(Wlc_Ntk_t *, Wlc_Ntk_t *)");
  }
  if ((0 < (pNew->vNameIds).nSize) || ((p->vNameIds).nSize < 1)) {
    __assert_fail("!Wlc_NtkHasNameId(pNew) && Wlc_NtkHasNameId(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcNtk.c"
                  ,0x240,"void Wlc_NtkTransferNames(Wlc_Ntk_t *, Wlc_Ntk_t *)");
  }
  if ((pNew->pManName != (Abc_Nam_t *)0x0) || (p->pManName == (Abc_Nam_t *)0x0)) {
    __assert_fail("pNew->pManName == NULL && p->pManName != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcNtk.c"
                  ,0x241,"void Wlc_NtkTransferNames(Wlc_Ntk_t *, Wlc_Ntk_t *)");
  }
  uVar1 = pNew->nObjsAlloc;
  if ((pNew->vNameIds).nCap < (int)uVar1) {
    piVar3 = (pNew->vNameIds).pArray;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar3 = (int *)realloc(piVar3,(long)(int)uVar1 << 2);
    }
    (pNew->vNameIds).pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pNew->vNameIds).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((pNew->vNameIds).pArray,0,(ulong)uVar1 * 4);
  }
  (pNew->vNameIds).nSize = uVar1;
  if (0 < p->nObjsAlloc) {
    lVar4 = 0;
    do {
      if ((p->vCopies).nSize <= lVar4) {
LAB_002fbb6f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = (p->vCopies).pArray[lVar4];
      if (((ulong)uVar1 != 0) && (lVar4 < (p->vNameIds).nSize)) {
        if ((p->vNameIds).nSize <= lVar4) goto LAB_002fbb6f;
        iVar2 = (p->vNameIds).pArray[lVar4];
        if (iVar2 != 0) {
          if (((int)uVar1 < 0) || ((pNew->vNameIds).nSize <= (int)uVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          (pNew->vNameIds).pArray[uVar1] = iVar2;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < p->nObjsAlloc);
  }
  pNew->pManName = p->pManName;
  p->pManName = (Abc_Nam_t *)0x0;
  piVar3 = (p->vNameIds).pArray;
  if (piVar3 != (int *)0x0) {
    free(piVar3);
    (p->vNameIds).pArray = (int *)0x0;
  }
  (p->vNameIds).nCap = 0;
  (p->vNameIds).nSize = 0;
  pNew->pMemTable = p->pMemTable;
  p->pMemTable = (Mem_Flex_t *)0x0;
  pNew->vTables = p->vTables;
  p->vTables = (Vec_Ptr_t *)0x0;
  return;
}

Assistant:

void Wlc_NtkTransferNames( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p )
{
    int i;
    assert( !Wlc_NtkHasCopy(pNew)   && Wlc_NtkHasCopy(p)   );
    assert( !Wlc_NtkHasNameId(pNew) && Wlc_NtkHasNameId(p) );
    assert( pNew->pManName  == NULL && p->pManName != NULL );
    Wlc_NtkCleanNameId( pNew );
    for ( i = 0; i < p->nObjsAlloc; i++ )
        if ( Wlc_ObjCopy(p, i) && i < Vec_IntSize(&p->vNameIds) && Wlc_ObjNameId(p, i) )
            Wlc_ObjSetNameId( pNew, Wlc_ObjCopy(p, i), Wlc_ObjNameId(p, i) );
    pNew->pManName = p->pManName; 
    p->pManName = NULL;
    Vec_IntErase( &p->vNameIds );
    // transfer table
    pNew->pMemTable = p->pMemTable;  p->pMemTable = NULL;
    pNew->vTables = p->vTables;      p->vTables = NULL;
}